

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_write_vec2_float(void *a,float *uv,uint32_t nr_of_vec2_positions,trico_stream_type st)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  uint64_t sz;
  ulong uVar4;
  uint32_t nr_of_compressed_v_bytes;
  uint32_t nr_of_compressed_u_bytes;
  uint8_t *compressed_v;
  uint8_t *compressed_u;
  float *v;
  float *u;
  uint local_50;
  uint local_4c;
  uint8_t *local_48;
  uint8_t *local_40;
  float *local_38;
  float *local_30;
  
  iVar2 = buffer_ready_for_writing((trico_archive *)a,1);
  iVar3 = 0;
  if (iVar2 != 0) {
    **(undefined1 **)((long)a + 8) = (char)st;
    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 1;
    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -1;
    iVar2 = buffer_ready_for_writing((trico_archive *)a,4);
    iVar3 = 0;
    if (iVar2 != 0) {
      **(uint32_t **)((long)a + 8) = nr_of_vec2_positions;
      *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
      local_30 = (float *)malloc((ulong)nr_of_vec2_positions << 2);
      local_38 = (float *)malloc((ulong)nr_of_vec2_positions << 2);
      trico_transpose_uv_aos_to_soa(&local_30,&local_38,uv,nr_of_vec2_positions);
      trico_compress(&local_4c,&local_40,local_30,nr_of_vec2_positions,4,10);
      free(local_30);
      iVar2 = buffer_ready_for_writing((trico_archive *)a,4);
      puVar1 = local_40;
      iVar3 = 0;
      if (iVar2 != 0) {
        **(uint **)((long)a + 8) = local_4c;
        *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
        *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
        uVar4 = (ulong)local_4c;
        iVar2 = buffer_ready_for_writing((trico_archive *)a,uVar4);
        if (iVar2 != 0) {
          memcpy(*(void **)((long)a + 8),puVar1,uVar4);
          *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar4;
          *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar4;
          free(local_40);
          trico_compress(&local_50,&local_48,local_38,nr_of_vec2_positions,4,10);
          free(local_38);
          iVar2 = buffer_ready_for_writing((trico_archive *)a,4);
          puVar1 = local_48;
          iVar3 = 0;
          if (iVar2 != 0) {
            **(uint **)((long)a + 8) = local_50;
            *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
            *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
            uVar4 = (ulong)local_50;
            iVar2 = buffer_ready_for_writing((trico_archive *)a,uVar4);
            if (iVar2 != 0) {
              memcpy(*(void **)((long)a + 8),puVar1,uVar4);
              *(long *)((long)a + 8) = *(long *)((long)a + 8) + uVar4;
              *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - uVar4;
              free(local_48);
              iVar3 = 1;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int trico_write_vec2_float(void* a, const float* uv, uint32_t nr_of_vec2_positions, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_vec2_positions, sizeof(uint32_t), 1, arch))
    return 0;

  float* u = (float*)trico_malloc(sizeof(float)*nr_of_vec2_positions);
  float* v = (float*)trico_malloc(sizeof(float)*nr_of_vec2_positions);
  trico_transpose_uv_aos_to_soa(&u, &v, uv, nr_of_vec2_positions);

  uint32_t nr_of_compressed_u_bytes;
  uint8_t* compressed_u;
  trico_compress(&nr_of_compressed_u_bytes, &compressed_u, u, nr_of_vec2_positions, 4, 10);

  trico_free(u);
  if (!write(&nr_of_compressed_u_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_u, 1, nr_of_compressed_u_bytes, arch))
    return 0;
  trico_free(compressed_u);

  uint32_t nr_of_compressed_v_bytes;
  uint8_t* compressed_v;
  trico_compress(&nr_of_compressed_v_bytes, &compressed_v, v, nr_of_vec2_positions, 4, 10);

  trico_free(v);
  if (!write(&nr_of_compressed_v_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_v, 1, nr_of_compressed_v_bytes, arch))
    return 0;
  trico_free(compressed_v);

  return 1;
  }